

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testModBus(void)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  C *pCVar5;
  C *pCVar6;
  String s_3_5;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_80;
  String s_1_5;
  Time local_3c;
  
  uVar1 = crc16_ansi(&DAT_00148c40,6,0);
  uVar2 = crc16_ansi(&DAT_00148c40,6,0xffff);
  uVar3 = crc16_ccit("\x01\x03",6,0);
  uVar4 = crc16_ccit("\x01\x03",6,0xffff);
  printf("crc16        = %04x\ncrc16 modbus = %04x\ncrc16 xmodem = %04x\ncrc16 ffff   = %04x\n",
         (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  axl::sys::Time::Time((Time *)&local_80,0x1e84,0);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (&s_3_5.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>,"%s.%l.%c");
  axl::sys::Time::format
            (&s_1_5,(Time *)&local_80,
             &s_3_5.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            (&s_3_5.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  axl::sys::Time::Time(&local_3c,0x4735,0);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (&local_80,"%s.%l.%c");
  axl::sys::Time::format(&s_3_5,&local_3c,&local_80);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_80);
  pCVar6 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  if (s_1_5.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length != 0) {
    pCVar6 = s_1_5.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p;
  }
  pCVar5 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  if (s_3_5.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length != 0) {
    pCVar5 = s_3_5.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p;
  }
  printf("t_1_5 = %s\nt_3_5 = %s\n",pCVar6,pCVar5);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            (&s_3_5.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            (&s_1_5.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  return;
}

Assistant:

void
testModBus() {
	uint8_t packet[] = {
		0x01, 0x03, 0x00, 0x30, 0x00, 0x01, // 0x00, 0x00,
	};

	printf(
		"crc16        = %04x\n"
		"crc16 modbus = %04x\n"
		"crc16 xmodem = %04x\n"
		"crc16 ffff   = %04x\n",
		crc16_ansi(packet, sizeof(packet), 0),
		crc16_ansi(packet, sizeof(packet), 0xffff),
		crc16_ccit(packet, sizeof(packet), 0),
		crc16_ccit(packet, sizeof(packet), 0xffff)
	);

	uint_t baud = 19200;

	uint64_t timeout_1_5;
	uint64_t timeout_3_5;

	if (baud > 19200) {
		timeout_1_5 = 7500;
		timeout_3_5 = 17500;
	} else {
		timeout_1_5 = 150000000 / baud;
		timeout_3_5 = 350000000 / baud;
	}

	sl::String s_1_5 = sys::Time(timeout_1_5, false).format("%s.%l.%c");
	sl::String s_3_5 = sys::Time(timeout_3_5, false).format("%s.%l.%c");

	printf("t_1_5 = %s\nt_3_5 = %s\n", s_1_5.sz(), s_3_5.sz());
}